

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriggerVariable.hpp
# Opt level: O0

bool __thiscall gmlc::concurrency::TriggerVariable::trigger(TriggerVariable *this)

{
  bool bVar1;
  lock_guard<std::mutex> *in_RDI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffd8;
  atomic<bool> *in_stack_ffffffffffffffe8;
  
  bVar1 = std::atomic<bool>::load(in_stack_ffffffffffffffe8,(memory_order)((ulong)in_RDI >> 0x20));
  if (bVar1) {
    std::lock_guard<std::mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffd8);
    std::atomic<bool>::store
              (in_stack_ffffffffffffffe8,SUB81((ulong)in_RDI >> 0x38,0),(memory_order)in_RDI);
    std::condition_variable::notify_all();
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x414d90);
  }
  return bVar1;
}

Assistant:

bool trigger()
    {
        if (!activated.load()) {
            return false;
        }
        std::lock_guard<std::mutex> lock(triggerLock);
        triggered.store(true);
        cv_trigger.notify_all();
        return true;
    }